

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

string * __thiscall
jaegertracing::Span::operationName_abi_cxx11_(string *__return_storage_ptr__,Span *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Span *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_mutex);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_operationName);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string operationName() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _operationName;
    }